

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  uchar *__s;
  Display *pDVar2;
  PFN_XChangeProperty p_Var3;
  unsigned_long uVar4;
  size_t sVar5;
  Atom AVar6;
  Atom AVar7;
  ulong uVar8;
  Window WVar9;
  Atom *pAVar10;
  int iVar11;
  Atom targets [4];
  XEvent local_f0;
  
  AVar7 = 0;
  memset(&local_f0,0,0xc0);
  p_Var3 = _glfw.x11.xlib.ChangeProperty;
  AVar6 = _glfw.x11.UTF8_STRING;
  pDVar2 = _glfw.x11.display;
  local_f0.type = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_001daee3;
  AVar7 = (event->xselectionrequest).target;
  if (AVar7 == _glfw.x11.TARGETS) {
    pAVar10 = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = 0x1f;
    WVar9 = (event->xkey).root;
    iVar11 = 4;
    AVar6 = 4;
    targets[0] = AVar7;
LAB_001dadc3:
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,WVar9,AVar1,AVar6,0x20,0,(uchar *)pAVar10,iVar11);
  }
  else {
    __s = *(uchar **)
           ((long)_glfw.x11.keynames +
           (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    if (AVar7 == _glfw.x11.MULTIPLE) {
      uVar4 = _glfwGetWindowPropertyX11
                        ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)targets);
      for (uVar8 = 0; p_Var3 = _glfw.x11.xlib.ChangeProperty, pDVar2 = _glfw.x11.display,
          uVar8 < uVar4; uVar8 = uVar8 + 2) {
        AVar1 = *(Atom *)(targets[0] + uVar8 * 8);
        if (AVar1 == AVar6 || AVar1 == 0x1f) {
          WVar9 = (event->xkey).root;
          AVar7 = *(Atom *)(targets[0] + 8 + uVar8 * 8);
          sVar5 = strlen((char *)__s);
          (*p_Var3)(pDVar2,WVar9,AVar7,AVar1,8,0,__s,(int)sVar5);
        }
        else {
          *(undefined8 *)(targets[0] + 8 + uVar8 * 8) = 0;
        }
      }
      (*_glfw.x11.xlib.ChangeProperty)
                (_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                 _glfw.x11.ATOM_PAIR,0x20,0,(uchar *)targets[0],(int)uVar4);
      (*_glfw.x11.xlib.Free)((void *)targets[0]);
    }
    else {
      if (AVar7 == _glfw.x11.SAVE_TARGETS) {
        WVar9 = (event->xkey).root;
        iVar11 = 0;
        pAVar10 = (Atom *)0x0;
        AVar6 = _glfw.x11.NULL_;
        goto LAB_001dadc3;
      }
      if (AVar7 != 0x1f && AVar7 != _glfw.x11.UTF8_STRING) {
        AVar7 = 0;
        goto LAB_001daee3;
      }
      WVar9 = (event->xkey).root;
      sVar5 = strlen((char *)__s);
      (*p_Var3)(pDVar2,WVar9,AVar1,AVar7,8,0,__s,(int)sVar5);
    }
  }
  AVar7 = (event->xselectionrequest).property;
LAB_001daee3:
  local_f0.xany.display = (event->xany).display;
  local_f0.xany.window = (event->xkey).root;
  local_f0.xkey.root = (event->xkey).subwindow;
  local_f0.xkey.subwindow = (event->xkey).time;
  local_f0.xselectionrequest.property = (event->xconfigure).above;
  local_f0.xkey.time = AVar7;
  (*_glfw.x11.xlib.SendEvent)(_glfw.x11.display,(event->xkey).root,0,0,&local_f0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}